

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O1

void nk_edit_draw_text(nk_command_buffer *out,nk_style_edit *style,float pos_x,float pos_y,
                      float x_offset,char *text,int byte_len,float row_height,nk_user_font *font,
                      nk_color background,nk_color foreground,nk_bool is_selected)

{
  long lVar1;
  nk_command_buffer *o;
  int iVar2;
  undefined4 in_register_0000000c;
  nk_user_font *f;
  uint uVar3;
  nk_color c;
  long lVar4;
  int iVar5;
  long lVar6;
  nk_style_edit *pnVar7;
  int iVar8;
  long lVar9;
  float fVar10;
  float in_XMM0_Db;
  undefined4 in_XMM0_Dd;
  float fVar11;
  float fVar12;
  undefined4 in_XMM3_Db;
  undefined4 uVar13;
  float fVar14;
  nk_rect rect;
  nk_rect b;
  nk_rect rect_00;
  nk_rect b_00;
  nk_text txt;
  nk_rune local_108;
  int local_104;
  ulong local_100;
  nk_command_buffer *local_f8;
  nk_style_edit *local_f0;
  nk_style_edit *local_e8;
  float local_dc;
  undefined8 local_d8;
  undefined8 uStack_d0;
  nk_user_font *local_c8;
  ulong local_c0;
  float local_b8;
  float fStack_b4;
  undefined4 uStack_ac;
  ulong local_a0;
  float local_98;
  undefined4 uStack_94;
  undefined8 local_88;
  undefined8 uStack_80;
  float local_78;
  nk_text local_68;
  undefined8 local_58;
  byte *local_40;
  ulong local_38;
  
  f = (nk_user_font *)CONCAT44(in_register_0000000c,byte_len);
  iVar5 = (int)text;
  if (iVar5 == 0 || style == (nk_style_edit *)0x0) {
    return;
  }
  c = SUB84(font,0);
  local_108 = 0;
  local_68.padding.x = 0.0;
  local_68.padding.y = 0.0;
  local_dc = pos_y;
  local_b8 = pos_x;
  fStack_b4 = in_XMM0_Db;
  uStack_ac = in_XMM0_Dd;
  local_98 = row_height;
  uStack_94 = in_XMM3_Db;
  local_78 = x_offset;
  local_68.background = c;
  local_68.text = background;
  iVar2 = nk_utf_decode((char *)style,&local_108,iVar5);
  if (iVar2 == 0) {
    return;
  }
  local_78 = local_78 + local_b8;
  if (0 < iVar5) {
    local_40 = (byte *)((long)&(style->normal).type + 1);
    local_88 = 0;
    uStack_80 = 0;
    local_100 = 0;
    uVar3 = 0;
    local_104 = iVar5;
    local_f8 = out;
    local_f0 = style;
    local_e8 = style;
    local_c8 = f;
    local_38 = (ulong)text & 0xffffffff;
LAB_0012f9ee:
    local_d8 = 0;
    uStack_d0 = 0;
    do {
      local_c0 = (ulong)uVar3;
      lVar6 = (long)(int)uVar3;
      lVar4 = lVar6 << 0x20;
      local_a0 = (ulong)(local_104 - uVar3);
      local_58 = local_40 + lVar6;
      iVar5 = -1;
      lVar9 = 0;
LAB_0012fa34:
      pnVar7 = local_e8;
      o = local_f8;
      if (local_108 == 0xd) {
        lVar1 = lVar6 + 1 + lVar9;
        iVar2 = nk_utf_decode((char *)(local_58 + lVar9),&local_108,(int)local_a0 + iVar5);
        lVar9 = lVar9 + 1;
        if (lVar1 < (long)local_38) goto code_r0x0012fa76;
        goto LAB_0012fc50;
      }
      iVar8 = (int)lVar9;
      if (local_108 == 10) goto LAB_0012fb0e;
      fVar10 = (*local_c8->width)(local_c8->userdata,local_c8->height,
                                  (char *)((long)&(local_e8->normal).type + (lVar4 >> 0x20)),iVar2);
      local_d8 = CONCAT44(local_d8._4_4_,(float)local_d8 + fVar10);
      iVar5 = (int)local_c0 + iVar2;
      uVar3 = iVar5 + iVar8;
      iVar2 = nk_utf_decode((char *)((long)&(pnVar7->normal).type + (long)(int)uVar3),&local_108,
                            ((int)local_a0 - iVar2) - iVar8);
      if ((local_104 <= (int)uVar3) || (iVar2 == 0)) {
        iVar5 = iVar5 + iVar8;
LAB_0012fc58:
        style = local_f0;
        f = local_c8;
        pnVar7 = local_e8;
        out = local_f8;
        fVar10 = (float)local_d8;
        uVar13 = local_d8._4_4_;
        goto LAB_0012fc97;
      }
    } while( true );
  }
  local_100 = 0;
  local_88 = 0;
  uStack_80 = 0;
  fVar10 = 0.0;
  uVar13 = 0;
  iVar5 = 0;
  pnVar7 = style;
LAB_0012fc97:
  if (0.0 < fVar10) {
    fVar11 = (float)local_88 + local_dc;
    fVar12 = local_b8;
    if ((int)local_100 == 0) {
      fVar12 = local_78;
    }
    fVar14 = local_98;
    if (foreground != (nk_color)0x0) {
      uStack_ac = local_88._4_4_;
      rect_00.y = fVar11;
      rect_00.x = fVar12;
      local_d8 = CONCAT44(local_98,fVar10);
      uStack_d0 = CONCAT44(uStack_94,uVar13);
      rect_00.h = local_98;
      rect_00.w = fVar10;
      local_b8 = fVar12;
      fStack_b4 = fVar11;
      nk_fill_rect(out,rect_00,0.0,c);
      fVar12 = local_b8;
      fVar11 = fStack_b4;
      fVar10 = (float)local_d8;
      fVar14 = local_d8._4_4_;
    }
    b_00.y = fVar11;
    b_00.x = fVar12;
    b_00.h = fVar14;
    b_00.w = fVar10;
    nk_widget_text(out,b_00,(char *)style,((int)pnVar7 + iVar5) - (int)style,&local_68,0x11,f);
  }
  return;
code_r0x0012fa76:
  lVar4 = lVar4 + 0x100000000;
  iVar5 = iVar5 + -1;
  if (iVar2 == 0) {
LAB_0012fc50:
    iVar5 = (int)local_c0 + (int)lVar9;
    goto LAB_0012fc58;
  }
  goto LAB_0012fa34;
LAB_0012fb0e:
  fVar12 = (float)local_88 + local_dc;
  fVar10 = local_b8;
  if ((int)local_100 == 0) {
    fVar10 = local_78;
  }
  fVar11 = local_98;
  if (foreground != (nk_color)0x0) {
    uStack_d0 = CONCAT44(uStack_94,local_d8._4_4_);
    local_58 = (byte *)CONCAT44(fVar12,fVar10);
    rect.y = fVar12;
    rect.x = fVar10;
    rect.h = local_98;
    rect.w = (float)local_d8;
    local_d8 = CONCAT44(local_98,(float)local_d8);
    nk_fill_rect(local_f8,rect,0.0,c);
    fVar11 = local_d8._4_4_;
    fVar10 = (float)local_58;
    fVar12 = local_58._4_4_;
  }
  f = local_c8;
  pnVar7 = local_e8;
  b.y = fVar12;
  b.x = fVar10;
  b.h = fVar11;
  b.w = (float)local_d8;
  nk_widget_text(o,b,(char *)local_f0,((int)((ulong)lVar4 >> 0x20) + (int)local_e8) - (int)local_f0,
                 &local_68,0x12,local_c8);
  uVar3 = (int)local_c0 + iVar8 + 1;
  local_f0 = (nk_style_edit *)((long)&(pnVar7->normal).type + (long)(int)uVar3);
  local_88 = CONCAT44(local_88._4_4_,(float)local_88 + local_98);
  iVar2 = nk_utf_decode((char *)local_f0,&local_108,(int)local_a0 + iVar5);
  if ((local_104 <= (int)uVar3) || (local_100 = (ulong)((int)local_100 + 1), iVar2 == 0))
  goto LAB_0012fc20;
  goto LAB_0012f9ee;
LAB_0012fc20:
  iVar5 = (int)local_c0 + iVar8 + 1;
  fVar10 = 0.0;
  uVar13 = 0;
  local_100 = 1;
  style = local_f0;
  pnVar7 = local_e8;
  out = local_f8;
  goto LAB_0012fc97;
}

Assistant:

NK_LIB void
nk_edit_draw_text(struct nk_command_buffer *out,
const struct nk_style_edit *style, float pos_x, float pos_y,
float x_offset, const char *text, int byte_len, float row_height,
const struct nk_user_font *font, struct nk_color background,
struct nk_color foreground, nk_bool is_selected)
{
NK_ASSERT(out);
NK_ASSERT(font);
NK_ASSERT(style);
if (!text || !byte_len || !out || !style) return;

{int glyph_len = 0;
nk_rune unicode = 0;
int text_len = 0;
float line_width = 0;
float glyph_width;
const char *line = text;
float line_offset = 0;
int line_count = 0;

struct nk_text txt;
txt.padding = nk_vec2(0,0);
txt.background = background;
txt.text = foreground;

glyph_len = nk_utf_decode(text+text_len, &unicode, byte_len-text_len);
if (!glyph_len) return;
while ((text_len < byte_len) && glyph_len)
{
if (unicode == '\n') {
/* new line separator so draw previous line */
struct nk_rect label;
label.y = pos_y + line_offset;
label.h = row_height;
label.w = line_width;
label.x = pos_x;
if (!line_count)
label.x += x_offset;

if (is_selected) /* selection needs to draw different background color */
nk_fill_rect(out, label, 0, background);
nk_widget_text(out, label, line, (int)((text + text_len) - line),
&txt, NK_TEXT_CENTERED, font);

text_len++;
line_count++;
line_width = 0;
line = text + text_len;
line_offset += row_height;
glyph_len = nk_utf_decode(text + text_len, &unicode, (int)(byte_len-text_len));
continue;
}
if (unicode == '\r') {
text_len++;
glyph_len = nk_utf_decode(text + text_len, &unicode, byte_len-text_len);
continue;
}
glyph_width = font->width(font->userdata, font->height, text+text_len, glyph_len);
line_width += (float)glyph_width;
text_len += glyph_len;
glyph_len = nk_utf_decode(text + text_len, &unicode, byte_len-text_len);
continue;
}
if (line_width > 0) {
/* draw last line */
struct nk_rect label;
label.y = pos_y + line_offset;
label.h = row_height;
label.w = line_width;
label.x = pos_x;
if (!line_count)
label.x += x_offset;

if (is_selected)
nk_fill_rect(out, label, 0, background);
nk_widget_text(out, label, line, (int)((text + text_len) - line),
&txt, NK_TEXT_LEFT, font);
}}
}